

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O1

void __thiscall ObserverManager_BadInput_Test::TestBody(ObserverManager_BadInput_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  stringstream out;
  AssertHelper AStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  internal local_1a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  ObserverManager::notify<TicTacProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Bad");
  std::__cxx11::stringbuf::str();
  message = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_1a0,"\"\"","out.str()",(char (*) [1])0x14d3a9,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_198.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = ((local_198.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x9d,message);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
    if ((long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1c0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1c0._M_dataplus._M_p + 8))();
      }
      local_1c0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST(ObserverManager, BadInput) {
    std::stringstream out;
    
    A* aBad = nullptr;
    ObserverManager::subscribe<FooBarProtocol>(aBad);
    
    B* bBad = nullptr;
    ObserverManager::unsubscribe<FooBarProtocol>(bBad);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Bad");
    
    EXPECT_EQ("", out.str());
}